

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_>::ResetSubElements
          (TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_> *this)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  long *in_RDI;
  int64_t noFather;
  TPZGeoEl *gel;
  int is;
  TPZRefPattern *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  int iVar4;
  int iVar5;
  
  iVar4 = 0;
  while (iVar5 = iVar4, iVar2 = (**(code **)(*in_RDI + 0x148))(), iVar4 < iVar2) {
    in_stack_ffffffffffffffe8 = (TPZRefPattern *)(**(code **)(*in_RDI + 0x1f8))(in_RDI,iVar5);
    if (in_stack_ffffffffffffffe8 != (TPZRefPattern *)0x0) {
      (*(in_stack_ffffffffffffffe8->super_TPZSavable)._vptr_TPZSavable[0x3e])
                (in_stack_ffffffffffffffe8,0xffffffffffffffff);
    }
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x2cf),(long)iVar5);
    *plVar3 = -1;
    iVar4 = iVar5 + 1;
  }
  bVar1 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)(in_RDI + 0x2d3));
  if (bVar1) {
    TPZAutoPointer<TPZRefPattern>::operator=
              ((TPZAutoPointer<TPZRefPattern> *)CONCAT44(iVar5,in_stack_fffffffffffffff0),
               in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

void TPZGeoElRefPattern<TGeo>::ResetSubElements()
{
	int is;
	for (is=0;is<NSubElements();is++)
	{
        TPZGeoEl *gel = SubElement(is);
        if (gel) {
            int64_t noFather = -1;
            gel->SetFatherIndex(noFather);
        }
		fSubEl[is] = -1;
	}
    /*  Delete and reset the fRefPattern.
        Once the sons are removed, fRefPattern could be also deleted.
        The user can keep the fRefPattern using Get and Set methods.*/
    if(this->fRefPattern) this->fRefPattern=NULL;
}